

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O3

TextureId __thiscall
CS248::GLResourceManager::createTextureFromData
          (GLResourceManager *this,uchar *data,int width,int height)

{
  TextureId texid;
  long *local_30;
  GLuint id;
  
  texid.id = (GLuint)&id;
  glGenTextures(1);
  bindTexture((GLResourceManager *)&local_30,texid);
  glTexImage2D(0xde1,0,0x1907,width,height,0,0x1908,0x1401,data);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return (TextureId)id;
}

Assistant:

TextureId GLResourceManager::createTextureFromData(const unsigned char* data, int width, int height) {
  TextureId texid = createTexture();
  auto tex_bind = bindTexture(texid);
  glTexImage2D(GL_TEXTURE_2D, /*level=*/0, GL_RGB, width, height, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, (void *)data);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);  
  //glGenerateMipmap(GL_TEXTURE_2D);
  return texid;
}